

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O2

void __thiscall
Rml::ControlledLifetimeResource<Rml::ComputedPropertyData>::Initialize
          (ControlledLifetimeResource<Rml::ComputedPropertyData> *this)

{
  code *pcVar1;
  bool bVar2;
  ComputedPropertyData *this_00;
  
  if (this->pointer != (ComputedPropertyData *)0x0) {
    bVar2 = Assert("Resource already initialized.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x2e);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  this_00 = (ComputedPropertyData *)operator_new(0xf8);
  memset(this_00,0,0xf8);
  ComputedPropertyData::ComputedPropertyData(this_00);
  this->pointer = this_00;
  return;
}

Assistant:

void Initialize()
	{
		RMLUI_ASSERTMSG(!pointer, "Resource already initialized.");
		pointer = new T();
	}